

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcolumnview.cpp
# Opt level: O3

QRect __thiscall QColumnView::visualRect(QColumnView *this,QModelIndex *index)

{
  long lVar1;
  long *plVar2;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  undefined1 auVar7 [16];
  QRect QVar8;
  
  uVar6 = 0xffffffff00000000;
  uVar4 = 0xffffffff;
  if ((((index->r < 0) || (index->c < 0)) || ((index->m).ptr == (QAbstractItemModel *)0x0)) ||
     (lVar1 = *(long *)&(this->super_QAbstractItemView).super_QAbstractScrollArea.super_QFrame.
                        super_QWidget.field_0x8, *(long *)(lVar1 + 0x550) == 0)) {
    uVar3 = 0;
    uVar5 = 0;
  }
  else {
    uVar4 = 0;
    do {
      plVar2 = *(long **)(*(long *)(lVar1 + 0x548) + uVar4 * 8);
      auVar7 = (**(code **)(*plVar2 + 0x1e0))(plVar2,index);
      if ((auVar7._0_4_ + -1 != auVar7._8_4_) || (auVar7._4_4_ + -1 != auVar7._12_4_)) {
        QVar8 = QWidget::frameGeometry(*(QWidget **)(*(long *)(lVar1 + 0x548) + uVar4 * 8));
        uVar3 = (ulong)(uint)(auVar7._0_4_ + QVar8.x1.m_i.m_i);
        uVar4 = (ulong)(uint)(auVar7._8_4_ + QVar8.x1.m_i.m_i);
        uVar5 = (ulong)(uint)(auVar7._4_4_ + QVar8.y1.m_i.m_i) << 0x20;
        uVar6 = (ulong)(uint)(auVar7._12_4_ + QVar8.y1.m_i.m_i) << 0x20;
        goto LAB_005611d9;
      }
      uVar4 = uVar4 + 1;
    } while (uVar4 < *(ulong *)(lVar1 + 0x550));
    uVar3 = 0;
    uVar5 = 0;
    uVar4 = 0xffffffff;
    uVar6 = 0xffffffff00000000;
  }
LAB_005611d9:
  QVar8._8_8_ = uVar4 | uVar6;
  QVar8.x1.m_i = (int)(uVar3 | uVar5);
  QVar8.y1.m_i = (int)((uVar3 | uVar5) >> 0x20);
  return QVar8;
}

Assistant:

QRect QColumnView::visualRect(const QModelIndex &index) const
{
    if (!index.isValid())
        return QRect();

    Q_D(const QColumnView);
    for (int i = 0; i < d->columns.size(); ++i) {
        QRect rect = d->columns.at(i)->visualRect(index);
        if (!rect.isNull()) {
            rect.translate(d->columns.at(i)->frameGeometry().topLeft());
            return rect;
        }
    }
    return QRect();
}